

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall acto::core::runtime_t::join(runtime_t *this,object_t *obj)

{
  long *plVar1;
  mutex_type *__m;
  bool bVar2;
  lock_guard<std::mutex> local_88;
  lock_guard<std::mutex> g;
  waiter_t node;
  object_t *obj_local;
  runtime_t *this_local;
  
  node.on_deleted._88_8_ = obj;
  plVar1 = (long *)(anonymous)::thread_context();
  if (*plVar1 != node.on_deleted._88_8_) {
    object_t::waiter_t::waiter_t((waiter_t *)&g);
    __m = (mutex_type *)(node.on_deleted._88_8_ + 8);
    std::lock_guard<std::mutex>::lock_guard(&local_88,__m);
    bVar2 = *(long *)(node.on_deleted._88_8_ + 0x30) != 0;
    if (bVar2) {
      event::reset((event *)&node);
      g._M_device = *(mutex_type **)(node.on_deleted._88_8_ + 0x58);
      *(lock_guard<std::mutex> **)(node.on_deleted._88_8_ + 0x58) = &g;
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_88);
    if (bVar2) {
      event::wait((event *)&node,__m);
    }
    object_t::waiter_t::~waiter_t((waiter_t *)&g);
  }
  return;
}

Assistant:

void runtime_t::join(object_t* const obj) {
  if (thread_context.active_actor == obj) {
    return;
  }

  object_t::waiter_t node;

  {
    std::lock_guard<std::mutex> g(obj->cs);

    if (obj->impl) {
      node.on_deleted.reset();
      node.next = obj->waiters;
      obj->waiters = &node;
    } else {
      return;
    }
  }

  node.on_deleted.wait();
}